

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
emplaceRealloc<slang::ast::ValueSymbol*&,slang::ast::PortSymbol*&>
          (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *this,
          pointer pos,ValueSymbol **args,PortSymbol **args_1)

{
  ulong uVar1;
  pointer p;
  Symbol *pSVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer ppVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar7 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar7 < uVar1 * 2) {
    uVar7 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar7 = 0x7ffffffffffffff;
  }
  lVar9 = (long)pos - *(long *)this;
  puVar3 = (undefined8 *)operator_new(uVar7 << 4);
  *(ValueSymbol **)((long)puVar3 + lVar9) = *args;
  *(PortSymbol **)((long)puVar3 + lVar9 + 8) = *args_1;
  p = *(pointer *)this;
  lVar8 = *(long *)(this + 8);
  lVar6 = (long)p + (lVar8 * 0x10 - (long)pos);
  ppVar5 = p;
  puVar4 = puVar3;
  if (lVar6 == 0) {
    if (lVar8 != 0) {
      do {
        pSVar2 = ppVar5->second;
        *puVar4 = ppVar5->first;
        puVar4[1] = pSVar2;
        ppVar5 = ppVar5 + 1;
        puVar4 = puVar4 + 2;
      } while (ppVar5 != pos);
    }
  }
  else {
    for (; ppVar5 != pos; ppVar5 = ppVar5 + 1) {
      pSVar2 = ppVar5->second;
      *puVar4 = ppVar5->first;
      puVar4[1] = pSVar2;
      puVar4 = puVar4 + 2;
    }
    memcpy((void *)((long)puVar3 + lVar9 + 0x10),pos,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
    lVar8 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar8 + 1;
  *(ulong *)(this + 0x10) = uVar7;
  *(undefined8 **)this = puVar3;
  return (pointer)((long)puVar3 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}